

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathEqualNodeSetFloat(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr arg,double f,int neq)

{
  double dVar1;
  xmlNodeSetPtr pxVar2;
  bool bVar3;
  xmlChar *val;
  xmlXPathObjectPtr pxVar4;
  long lVar5;
  int local_44;
  
  local_44 = 0;
  if (((arg->type | XPATH_USERS) == XPATH_XSLT_TREE) &&
     (pxVar2 = arg->nodesetval, pxVar2 != (xmlNodeSetPtr)0x0)) {
    local_44 = 0;
    for (lVar5 = 0; lVar5 < pxVar2->nodeNr; lVar5 = lVar5 + 1) {
      val = xmlXPathCastNodeToString(pxVar2->nodeTab[lVar5]);
      if (val != (xmlChar *)0x0) {
        pxVar4 = xmlXPathCacheNewString(ctxt->context,val);
        valuePush(ctxt,pxVar4);
        (*xmlFree)(val);
        xmlXPathNumberFunction(ctxt,1);
        pxVar4 = valuePop(ctxt);
        dVar1 = pxVar4->floatval;
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        if (NAN(dVar1)) {
          if (neq != 0) {
            local_44 = 1;
          }
        }
        else {
          bVar3 = dVar1 == f;
          if (neq == 0) {
            bVar3 = dVar1 != f;
          }
          if (!bVar3) {
            return 1;
          }
        }
      }
    }
  }
  return local_44;
}

Assistant:

static int
xmlXPathEqualNodeSetFloat(xmlXPathParserContextPtr ctxt,
    xmlXPathObjectPtr arg, double f, int neq) {
  int i, ret=0;
  xmlNodeSetPtr ns;
  xmlChar *str2;
  xmlXPathObjectPtr val;
  double v;

    if ((arg == NULL) ||
	((arg->type != XPATH_NODESET) && (arg->type != XPATH_XSLT_TREE)))
        return(0);

    ns = arg->nodesetval;
    if (ns != NULL) {
	for (i=0;i<ns->nodeNr;i++) {
	    str2 = xmlXPathCastNodeToString(ns->nodeTab[i]);
	    if (str2 != NULL) {
		valuePush(ctxt, xmlXPathCacheNewString(ctxt->context, str2));
		xmlFree(str2);
		xmlXPathNumberFunction(ctxt, 1);
		val = valuePop(ctxt);
		v = val->floatval;
		xmlXPathReleaseObject(ctxt->context, val);
		if (!xmlXPathIsNaN(v)) {
		    if ((!neq) && (v==f)) {
			ret = 1;
			break;
		    } else if ((neq) && (v!=f)) {
			ret = 1;
			break;
		    }
		} else {	/* NaN is unequal to any value */
		    if (neq)
			ret = 1;
		}
	    }
	}
    }

    return(ret);
}